

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

input_t vischar_move_u(tgestate_t *state,vischar_t *vischar,int scale)

{
  undefined2 uVar1;
  input_t iVar2;
  short sVar3;
  
  uVar1 = (vischar->mi).mappos.u;
  sVar3 = uVar1 - (ushort)(vischar->target).u * (short)scale;
  iVar2 = 8;
  if ((sVar3 < 3) && (iVar2 = 4, -3 < sVar3)) {
    vischar->counter_and_flags = vischar->counter_and_flags | 0x20;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

input_t vischar_move_u(tgestate_t *state,
                       vischar_t  *vischar,
                       int         scale)
{
  int16_t delta; /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(scale == 1 || scale == 4 || scale == 8);

  /* I'm assuming here (until proven otherwise) that HL and IY point to the
   * same vischar on entry. */
  assert(vischar == state->IY);

  // which one's the target value?
  // one will be "where i am" one will be "where i need to be"
  // suspect that mi.pos.x is "where i am"
  // and that pos.x is "where i need to be"

  delta = (int16_t) vischar->mi.mappos.u - (int16_t) vischar->target.u * scale;
  /* Conv: Rewritten to simplify. Split D,E checking boiled down to -3/+3. */
  if (delta >= 3)
    return input_RIGHT + input_DOWN;
  else if (delta <= -3)
    return input_LEFT + input_UP;
  else
  {
    vischar->counter_and_flags |= vischar_BYTE7_V_DOMINANT;
    return input_NONE;
  }
}